

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

void __thiscall QLocale::QLocale(QLocale *this,QStringView name)

{
  quint16 qVar1;
  bool bVar2;
  QLocaleId lid;
  undefined **ppuVar3;
  qsizetype qVar4;
  storage_type_conflict *psVar5;
  QStringView name_00;
  QStringView rhs;
  storage_type_conflict *extraout_RDX;
  
  psVar5 = name.m_data;
  if ((QLocaleId *)name.m_size == (QLocaleId *)0x1) {
    rhs.m_data = L"C";
    rhs.m_size = 1;
    bVar2 = QtPrivate::equalStrings(name,rhs);
    psVar5 = extraout_RDX;
    if (bVar2) {
      ppuVar3 = &c_private()::c_locale;
      goto LAB_0030fd5d;
    }
  }
  name_00.m_data = psVar5;
  name_00.m_size = (qsizetype)name.m_data;
  lid = QLocaleId::fromName((QLocaleId *)name.m_size,name_00);
  qVar4 = QLocaleData::findLocaleIndex(lid);
  ppuVar3 = (undefined **)operator_new(0x20);
  qVar1 = locale_data[qVar4].m_language_id;
  ((QLocalePrivate *)ppuVar3)->m_data = locale_data + qVar4;
  (((QLocalePrivate *)ppuVar3)->ref)._q_value.super___atomic_base<int>._M_i = 0;
  ((QLocalePrivate *)ppuVar3)->m_index = qVar4;
  (((QLocalePrivate *)ppuVar3)->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>
  .super_QFlagsStorage<QLocale::NumberOption>.i = (uint)(qVar1 == 1);
LAB_0030fd5d:
  (this->d).d.ptr = (QLocalePrivate *)ppuVar3;
  LOCK();
  (((QLocalePrivate *)ppuVar3)->ref)._q_value.super___atomic_base<int>._M_i =
       (((QLocalePrivate *)ppuVar3)->ref)._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

QLocale::QLocale(QStringView name)
    : d(localePrivateByName(name))
{
}